

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,OwnPromiseNode *innerParam,SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  PromiseNode *pPVar1;
  OwnPromiseNode *innerParam_local;
  ChainPromiseNode *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_0059ef40;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0059ef88;
  this->state = STEP1;
  other = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(innerParam);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&this->inner,other);
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (OwnPromiseNode *)0x0;
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->inner);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])();
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->inner);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(OwnPromiseNode innerParam, SourceLocation location)
    : Event(location), state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}